

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.cpp
# Opt level: O2

void __thiscall PingServer::incomingData(PingServer *this,Stream *stream)

{
  long *plVar1;
  ostream *poVar2;
  IPV4Address source;
  ushort local_44;
  char c;
  
  std::operator<<((ostream *)&std::cerr,"new data....");
  if (stream != (Stream *)0x0) {
    plVar1 = (long *)__dynamic_cast(stream,&Dashel::Stream::typeinfo,&Dashel::PacketStream::typeinfo
                                    ,0xffffffffffffffff);
    if (plVar1 != (long *)0x0) {
      Dashel::IPV4Address::IPV4Address(&source,0,0);
      (**(code **)(*plVar1 + 8))(plVar1,&source);
      poVar2 = std::operator<<((ostream *)&std::cerr,"Ping from ");
      Dashel::IPV4Address::hostname_abi_cxx11_();
      poVar2 = std::operator<<(poVar2,(string *)&c);
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_44);
      std::operator<<(poVar2,": ");
      std::__cxx11::string::~string((string *)&c);
      while( true ) {
        (**(code **)(*(long *)((long)plVar1 + *(long *)(*plVar1 + -0x18)) + 0x20))
                  ((long)plVar1 + *(long *)(*plVar1 + -0x18),(string *)&c,1);
        if (c == '\0') break;
        std::operator<<((ostream *)&std::cerr,c);
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      return;
    }
  }
  __assert_fail("packetStream",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/aseba-community[P]dashel/examples/udp.cpp"
                ,0x1d,"virtual void PingServer::incomingData(Stream *)");
}

Assistant:

void incomingData(Stream* stream)
	{
		cerr << "new data....";
		PacketStream* packetStream = dynamic_cast<PacketStream*>(stream);
		assert(packetStream);
		IPV4Address source;

		packetStream->receive(source);
		cerr << "Ping from " << source.hostname() << ":" << source.port << ": ";

		char c;
		while (true)
		{
			packetStream->read(&c, 1);
			if (c)
				cerr << c;
			else
				break;
		}
		cerr << endl;
	}